

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O0

string_view
winmd::reader::read<std::basic_string_view<char,std::char_traits<char>>>(byte_view *cursor)

{
  uint8_t *__str;
  byte_view local_38;
  uint local_24;
  byte_view *pbStack_20;
  uint32_t length;
  byte_view *cursor_local;
  string_view result;
  
  pbStack_20 = cursor;
  local_24 = uncompress_unsigned(cursor);
  __str = byte_view::begin(pbStack_20);
  cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&cursor_local,(char *)__str,
             (ulong)local_24);
  byte_view::seek(&local_38,(uint32_t)pbStack_20);
  byte_view::operator=(pbStack_20,&local_38);
  return _cursor_local;
}

Assistant:

inline std::string_view read<std::string_view>(byte_view& cursor)
    {
        uint32_t const length = uncompress_unsigned(cursor);
        std::string_view result{ reinterpret_cast<const char*>(cursor.begin()), length };
        cursor = cursor.seek(length);
        return result;
    }